

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_manager.cpp
# Opt level: O0

int __thiscall
libtorrent::aux::bandwidth_manager::request_bandwidth
          (bandwidth_manager *this,shared_ptr<libtorrent::aux::bandwidth_socket> *peer,int blk,
          int priority,span<libtorrent::aux::bandwidth_channel_*> channels)

{
  value_type pbVar1;
  bool bVar2;
  bandwidth_channel **ppbVar3;
  value_type *ppbVar4;
  long idx;
  bandwidth_channel **c;
  bandwidth_channel **__end2;
  bandwidth_channel **__begin2;
  span<libtorrent::aux::bandwidth_channel_*> *__range2;
  shared_ptr<libtorrent::aux::bandwidth_socket> local_c0;
  undefined1 local_b0 [8];
  bw_request bwr;
  int k;
  int priority_local;
  int blk_local;
  shared_ptr<libtorrent::aux::bandwidth_socket> *peer_local;
  bandwidth_manager *this_local;
  span<libtorrent::aux::bandwidth_channel_*> channels_local;
  
  channels_local.m_ptr = (bandwidth_channel **)channels.m_len;
  this_local = (bandwidth_manager *)channels.m_ptr;
  if ((this->m_abort & 1U) == 0) {
    bVar2 = span<libtorrent::aux::bandwidth_channel_*>::empty
                      ((span<libtorrent::aux::bandwidth_channel_*> *)&this_local);
    channels_local.m_len._4_4_ = blk;
    if (!bVar2) {
      bwr.channel.super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems[9]._4_4_ = 0;
      ::std::shared_ptr<libtorrent::aux::bandwidth_socket>::shared_ptr(&local_c0,peer);
      bw_request::bw_request((bw_request *)local_b0,&local_c0,blk,priority);
      ::std::shared_ptr<libtorrent::aux::bandwidth_socket>::~shared_ptr(&local_c0);
      __end2 = span<libtorrent::aux::bandwidth_channel_*>::begin
                         ((span<libtorrent::aux::bandwidth_channel_*> *)&this_local);
      ppbVar3 = span<libtorrent::aux::bandwidth_channel_*>::end
                          ((span<libtorrent::aux::bandwidth_channel_*> *)&this_local);
      for (; __end2 != ppbVar3; __end2 = __end2 + 1) {
        bVar2 = bandwidth_channel::need_queueing(*__end2,blk);
        if (bVar2) {
          pbVar1 = *__end2;
          idx = (long)bwr.channel.super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems
                      [9]._4_4_;
          bwr.channel.super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems[9]._4_4_ =
               bwr.channel.super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems[9]._4_4_
               + 1;
          ppbVar4 = container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                    ::operator[]((container_wrapper<libtorrent::aux::bandwidth_channel_*,_long,_std::array<libtorrent::aux::bandwidth_channel_*,_10UL>_>
                                  *)&bwr.request_size,idx);
          *ppbVar4 = pbVar1;
        }
      }
      if (bwr.channel.super_array<libtorrent::aux::bandwidth_channel_*,_10UL>._M_elems[9]._4_4_ != 0
         ) {
        this->m_queued_bytes = this->m_queued_bytes + (long)blk;
        ::std::vector<libtorrent::aux::bw_request,_std::allocator<libtorrent::aux::bw_request>_>::
        push_back(&this->m_queue,(value_type *)local_b0);
        channels_local.m_len._4_4_ = 0;
      }
      bw_request::~bw_request((bw_request *)local_b0);
    }
  }
  else {
    channels_local.m_len._4_4_ = 0;
  }
  return channels_local.m_len._4_4_;
}

Assistant:

int bandwidth_manager::request_bandwidth(std::shared_ptr<bandwidth_socket> peer
		, int const blk, int const priority, span<bandwidth_channel*> channels)
	{
		INVARIANT_CHECK;
		if (m_abort) return 0;

		TORRENT_ASSERT(blk > 0);
		TORRENT_ASSERT(priority > 0);

		// if this assert is hit, the peer is requesting more bandwidth before
		// being assigned bandwidth for an already outstanding request
		TORRENT_ASSERT(!is_queued(peer.get()));

		if (channels.empty())
		{
			// the connection is not rate limited by any of its
			// bandwidth channels, or it doesn't belong to any
			// channels. There's no point in adding it to
			// the queue, just satisfy the request immediately
			return blk;
		}

		int k = 0;
		bw_request bwr(std::move(peer), blk, priority);
		for (auto const& c : channels)
		{
			if (c->need_queueing(blk))
				bwr.channel[k++] = c;
		}

		if (k == 0) return blk;

		m_queued_bytes += blk;
		m_queue.push_back(std::move(bwr));
		return 0;
	}